

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void ManagerTest<ttt::Board,mcts::RandomPlayout<ttt::Board>>(void)

{
  IBot<ttt::Board> *bot;
  longlong lVar1;
  double dVar2;
  pointer plVar3;
  pointer ppIVar4;
  FixedMctsBot<ttt::Board,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_(*)(const_ttt::Board_&,_long_long)>
  *this;
  MinimaxBot<ttt::Board,_minimax::ABeta<ttt::Board,_minimax::Eval<ttt::Board>_>_> *this_00;
  ostream *poVar5;
  int iVar6;
  pointer plVar7;
  pointer ppIVar8;
  vector<long_long,_std::allocator<long_long>_> bot_ids;
  _func_vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_Board_ptr_longlong *local_a0;
  vector<game::IBot<ttt::Board>_*,_std::allocator<game::IBot<ttt::Board>_*>_> bots;
  Board game;
  Manager<ttt::Board> manager;
  
  ttt::Board::Board(&game);
  ::manager::Manager<ttt::Board>::Manager(&manager,&game);
  bots.super__Vector_base<game::IBot<ttt::Board>_*,_std::allocator<game::IBot<ttt::Board>_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bots.super__Vector_base<game::IBot<ttt::Board>_*,_std::allocator<game::IBot<ttt::Board>_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bots.super__Vector_base<game::IBot<ttt::Board>_*,_std::allocator<game::IBot<ttt::Board>_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this = (FixedMctsBot<ttt::Board,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_(*)(const_ttt::Board_&,_long_long)>
          *)operator_new(0x20);
  local_a0 = mcts::MCTS_parallel<ttt::Board,mcts::RandomPlayout<ttt::Board>>;
  generic_bots::
  FixedMctsBot<ttt::Board,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_(*)(const_ttt::Board_&,_long_long)>
  ::FixedMctsBot(this,&game,&local_a0,1000);
  bot_ids.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)this;
  std::vector<game::IBot<ttt::Board>*,std::allocator<game::IBot<ttt::Board>*>>::
  emplace_back<generic_bots::FixedMctsBot<ttt::Board,std::vector<mcts::MCTSResults,std::allocator<mcts::MCTSResults>>(*)(ttt::Board_const&,long_long)>*>
            ((vector<game::IBot<ttt::Board>*,std::allocator<game::IBot<ttt::Board>*>> *)&bots,
             (FixedMctsBot<ttt::Board,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_(*)(const_ttt::Board_&,_long_long)>
              **)&bot_ids);
  this_00 = (MinimaxBot<ttt::Board,_minimax::ABeta<ttt::Board,_minimax::Eval<ttt::Board>_>_> *)
            operator_new(0x18);
  generic_bots::MinimaxBot<ttt::Board,_minimax::ABeta<ttt::Board,_minimax::Eval<ttt::Board>_>_>::
  MinimaxBot(this_00,&game,9);
  bot_ids.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)this_00;
  std::vector<game::IBot<ttt::Board>*,std::allocator<game::IBot<ttt::Board>*>>::
  emplace_back<generic_bots::MinimaxBot<ttt::Board,minimax::ABeta<ttt::Board,minimax::Eval<ttt::Board>>>*>
            ((vector<game::IBot<ttt::Board>*,std::allocator<game::IBot<ttt::Board>*>> *)&bots,
             (MinimaxBot<ttt::Board,_minimax::ABeta<ttt::Board,_minimax::Eval<ttt::Board>_>_> **)
             &bot_ids);
  ppIVar4 = bots.
            super__Vector_base<game::IBot<ttt::Board>_*,_std::allocator<game::IBot<ttt::Board>_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  bot_ids.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  bot_ids.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  bot_ids.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  for (ppIVar8 = bots.
                 super__Vector_base<game::IBot<ttt::Board>_*,_std::allocator<game::IBot<ttt::Board>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppIVar8 != ppIVar4;
      ppIVar8 = ppIVar8 + 1) {
    bot = *ppIVar8;
    local_a0 = (_func_vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_Board_ptr_longlong
                *)::manager::Manager<ttt::Board>::AddBot(&manager,bot);
    std::vector<long_long,_std::allocator<long_long>_>::emplace_back<long_long>
              (&bot_ids,(longlong *)&local_a0);
    if (bot != (IBot<ttt::Board> *)0x0) {
      (*bot->_vptr_IBot[1])(bot);
    }
  }
  std::operator<<((ostream *)&std::cout,"Initial ratings:");
  plVar3 = bot_ids.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (plVar7 = bot_ids.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                super__Vector_impl_data._M_start; plVar7 != plVar3; plVar7 = plVar7 + 1) {
    lVar1 = *plVar7;
    std::operator<<((ostream *)&std::cout,' ');
    dVar2 = ::manager::Manager<ttt::Board>::GetBotRating(&manager,lVar1);
    std::ostream::_M_insert<double>(dVar2);
  }
  std::operator<<((ostream *)&std::cout,'\n');
  iVar6 = 0;
  while (iVar6 != 200) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Round ");
    iVar6 = iVar6 + 1;
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar6);
    poVar5 = std::operator<<(poVar5," / ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,200);
    std::operator<<(poVar5,'\n');
    ::manager::Manager<ttt::Board>::RoundRobin(&manager);
    std::operator<<((ostream *)&std::cout,"New ratings:");
    plVar3 = bot_ids.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (plVar7 = bot_ids.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                  super__Vector_impl_data._M_start; plVar7 != plVar3; plVar7 = plVar7 + 1) {
      lVar1 = *plVar7;
      std::operator<<((ostream *)&std::cout,' ');
      dVar2 = ::manager::Manager<ttt::Board>::GetBotRating(&manager,lVar1);
      std::ostream::_M_insert<double>(dVar2);
    }
    std::operator<<((ostream *)&std::cout,'\n');
  }
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            (&bot_ids.super__Vector_base<long_long,_std::allocator<long_long>_>);
  std::_Vector_base<game::IBot<ttt::Board>_*,_std::allocator<game::IBot<ttt::Board>_*>_>::
  ~_Vector_base(&bots.
                 super__Vector_base<game::IBot<ttt::Board>_*,_std::allocator<game::IBot<ttt::Board>_*>_>
               );
  ::manager::Manager<ttt::Board>::~Manager(&manager);
  return;
}

Assistant:

void
ManagerTest()
{
    IGame game;
    manager::Manager<IGame> manager(&game);

    std::vector<game::IBot<IGame> *> bots;
    bots.emplace_back(new generic_bots::FixedMctsBot<IGame, std::vector<mcts::MCTSResults> (*)(const IGame &, long long)>(&game, mcts::MCTS_parallel<IGame, RandomPlayout>, 1000));
    bots.emplace_back(new generic_bots::MinimaxBot<IGame, minimax::ABeta<IGame>>(&game, 9));

    std::vector<long long> bot_ids;
    for (auto bot : bots)
    {
        bot_ids.emplace_back(manager.AddBot(bot));
        delete bot;
    }

    std::cout << "Initial ratings:";
    for (long long id : bot_ids)
        std::cout << ' ' << manager.GetBotRating(id);
    std::cout << '\n';

    int num_rounds = 200;
    for (int i = 0; i < num_rounds; ++i)
    {
        std::cout << "Round " << i + 1 << " / " << num_rounds << '\n';
        manager.RoundRobin();
        std::cout << "New ratings:";
        for (long long id : bot_ids)
            std::cout << ' ' << manager.GetBotRating(id);
        std::cout << '\n';
    }
}